

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O1

void __thiscall UtestShell::print(UtestShell *this,char *text,char *fileName,size_t lineNumber)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar3;
  SimpleString stringToPrint;
  SimpleString local_40;
  SimpleString local_30;
  TestResult *pTVar2;
  
  SimpleString::SimpleString(&local_40,"\n");
  SimpleString::operator+=(&local_40,fileName);
  SimpleString::operator+=(&local_40,":");
  StringFrom((unsigned_long)&local_30);
  SimpleString::operator+=(&local_40,&local_30);
  SimpleString::~SimpleString(&local_30);
  SimpleString::operator+=(&local_40," ");
  SimpleString::operator+=(&local_40,text);
  pTVar2 = testResult_;
  if (testResult_ == (TestResult *)0x0) {
    OutsideTestRunnerUTest::instance();
    iVar1 = (*OutsideTestRunnerUTest::instance::instance_.super_UtestShell._vptr_UtestShell[0x29])
                      (&OutsideTestRunnerUTest::instance::instance_);
    pTVar2 = (TestResult *)CONCAT44(extraout_var,iVar1);
  }
  pcVar3 = SimpleString::asCharString(&local_40);
  (*pTVar2->_vptr_TestResult[0xe])(pTVar2,pcVar3);
  SimpleString::~SimpleString(&local_40);
  return;
}

Assistant:

void UtestShell::print(const char *text, const char* fileName, size_t lineNumber)
{
    SimpleString stringToPrint = "\n";
    stringToPrint += fileName;
    stringToPrint += ":";
    stringToPrint += StringFrom(lineNumber);
    stringToPrint += " ";
    stringToPrint += text;
    getTestResult()->print(stringToPrint.asCharString());
}